

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImDrawData::DeIndexAllBuffers(ImDrawData *this)

{
  ImDrawList *pIVar1;
  bool bVar2;
  ImDrawList **ppIVar3;
  uint *puVar4;
  ImDrawVert *pIVar5;
  long in_RDI;
  int j;
  ImDrawList *cmd_list;
  int i;
  ImVector<ImDrawVert> new_vtx_buffer;
  int in_stack_ffffffffffffff8c;
  ImDrawVert *in_stack_ffffffffffffff90;
  int local_38;
  int local_1c;
  ImVector<ImDrawVert> local_18;
  
  ImVector<ImDrawVert>::ImVector(&local_18);
  *(undefined4 *)(in_RDI + 8) = 0;
  *(undefined4 *)(in_RDI + 0xc) = 0;
  for (local_1c = 0; local_1c < *(int *)(in_RDI + 4); local_1c = local_1c + 1) {
    ppIVar3 = ImVector<ImDrawList_*>::operator[]((ImVector<ImDrawList_*> *)(in_RDI + 0x10),local_1c)
    ;
    pIVar1 = *ppIVar3;
    bVar2 = ImVector<unsigned_int>::empty(&pIVar1->IdxBuffer);
    if (!bVar2) {
      ImVector<ImDrawVert>::resize
                ((ImVector<ImDrawVert> *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
      for (local_38 = 0; local_38 < (pIVar1->IdxBuffer).Size; local_38 = local_38 + 1) {
        puVar4 = ImVector<unsigned_int>::operator[](&pIVar1->IdxBuffer,local_38);
        pIVar5 = ImVector<ImDrawVert>::operator[](&pIVar1->VtxBuffer,*puVar4);
        in_stack_ffffffffffffff90 = ImVector<ImDrawVert>::operator[](&local_18,local_38);
        in_stack_ffffffffffffff90->pos = pIVar5->pos;
        in_stack_ffffffffffffff90->uv = pIVar5->uv;
        in_stack_ffffffffffffff90->col = pIVar5->col;
      }
      ImVector<ImDrawVert>::swap(&pIVar1->VtxBuffer,&local_18);
      ImVector<unsigned_int>::resize
                ((ImVector<unsigned_int> *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
      *(int *)(in_RDI + 0xc) = (pIVar1->VtxBuffer).Size + *(int *)(in_RDI + 0xc);
    }
  }
  ImVector<ImDrawVert>::~ImVector((ImVector<ImDrawVert> *)in_stack_ffffffffffffff90);
  return;
}

Assistant:

void ImDrawData::DeIndexAllBuffers()
{
    ImVector<ImDrawVert> new_vtx_buffer;
    TotalVtxCount = TotalIdxCount = 0;
    for (int i = 0; i < CmdListsCount; i++)
    {
        ImDrawList* cmd_list = CmdLists[i];
        if (cmd_list->IdxBuffer.empty())
            continue;
        new_vtx_buffer.resize(cmd_list->IdxBuffer.Size);
        for (int j = 0; j < cmd_list->IdxBuffer.Size; j++)
            new_vtx_buffer[j] = cmd_list->VtxBuffer[cmd_list->IdxBuffer[j]];
        cmd_list->VtxBuffer.swap(new_vtx_buffer);
        cmd_list->IdxBuffer.resize(0);
        TotalVtxCount += cmd_list->VtxBuffer.Size;
    }
}